

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
MutatorsIRCCommand::trigger
          (MutatorsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar6;
  size_t sVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  __sv_type _Var9;
  size_t local_188;
  char *local_180;
  size_t local_168;
  char *local_160;
  size_t local_148;
  char *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *mutator;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  long local_a0;
  Server *server;
  uint local_84;
  undefined8 uStack_80;
  uint i;
  size_t index;
  string list;
  int type;
  Channel *chan;
  IRC_Bot *source_local;
  MutatorsIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  pcVar6 = channel._M_str;
  sVar7 = channel._M_len;
  lVar3 = Jupiter::IRC::Client::getChannel(source,sVar7,pcVar6);
  if (lVar3 != 0) {
    list.field_2._12_4_ = Jupiter::IRC::Client::Channel::getType();
    std::__cxx11::string::string((string *)&index);
    uStack_80 = 0;
    local_84 = 0;
    while( true ) {
      uVar5 = (ulong)local_84;
      RenX::getCore();
      uVar4 = RenX::Core::getServerCount();
      if (uVar5 == uVar4) break;
      uVar5 = RenX::getCore();
      local_a0 = RenX::Core::getServer(uVar5);
      bVar1 = RenX::Server::isLogChanType((int)local_a0);
      if ((bVar1 & 1) != 0) {
        s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range4,
                     "\x0303[Mutators]\x0f",0xe);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range4);
        std::__cxx11::string::~string((string *)&__range4);
        this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_a0 + 0x40);
        __end4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(this_00);
        mutator = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(this_00);
        while (bVar2 = __gnu_cxx::
                       operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&mutator), ((bVar2 ^ 0xffU) & 1) != 0) {
          local_e0 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&__end4);
          s_abi_cxx11_(&local_120," ",1);
          std::operator+(&local_100,&local_120,local_e0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                     &local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_120);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end4);
        }
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_a0 + 0x40));
        if (bVar2) {
          bVar8 = sv("No mutators loaded",0x12);
          local_148 = bVar8._M_len;
          local_140 = bVar8._M_str;
          Jupiter::IRC::Client::sendMessage(source,sVar7,pcVar6,local_148,local_140);
        }
        else {
          _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&index);
          local_168 = _Var9._M_len;
          local_160 = _Var9._M_str;
          Jupiter::IRC::Client::sendMessage(source,sVar7,pcVar6,local_168,local_160);
        }
      }
      local_84 = local_84 + 1;
    }
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index);
    if (bVar2) {
      bVar8 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
      local_188 = bVar8._M_len;
      local_180 = bVar8._M_str;
      Jupiter::IRC::Client::sendMessage(source,sVar7,pcVar6,local_188,local_180);
    }
    std::__cxx11::string::~string((string *)&index);
  }
  return;
}

Assistant:

void MutatorsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		std::string list;
		size_t index = 0;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				list = IRCCOLOR "03[Mutators]"s IRCNORMAL;
				for (const auto& mutator : server->mutators) {
					list += " "s + mutator;
				}

				if (server->mutators.empty()) {
					source->sendMessage(channel, "No mutators loaded"sv);
				}
				else {
					source->sendMessage(channel, list);
				}
			}
		}
		if (list.empty())
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}